

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyUtil.c
# Opt level: O0

int Ivy_CutTruthPrint(Ivy_Man_t *p,Ivy_Cut_t *pCut,uint uTruth)

{
  int iVar1;
  Vec_Ptr_t *p_00;
  Ivy_Obj_t *pObj_00;
  bool bVar2;
  int local_64;
  int local_48;
  int fVerbose;
  int k;
  int i;
  int nPresent;
  int nLatches;
  Ivy_Obj_t *pFanout;
  Ivy_Obj_t *pObj;
  Vec_Ptr_t *vArray;
  uint uTruth_local;
  Ivy_Cut_t *pCut_local;
  Ivy_Man_t *p_local;
  
  i = 0;
  k = 0;
  for (fVerbose = 0; fVerbose < pCut->nSize; fVerbose = fVerbose + 1) {
    iVar1 = Ivy_LeafLat(pCut->pArray[fVerbose]);
    i = iVar1 + i;
  }
  p_00 = Vec_PtrAlloc(100);
  fVerbose = 0;
  do {
    if (pCut->nSize <= fVerbose) {
      Vec_PtrSize(p_00);
      if (k < i) {
        local_64 = (i - k) * 2;
      }
      else {
        local_64 = 0;
      }
      return local_64;
    }
    iVar1 = Ivy_LeafId(pCut->pArray[fVerbose]);
    pObj_00 = Ivy_ManObj(p,iVar1);
    local_48 = 0;
    Ivy_ObjCollectFanouts(p,pObj_00,p_00);
    while( true ) {
      iVar1 = Vec_PtrSize(p_00);
      bVar2 = false;
      if (local_48 < iVar1) {
        _nPresent = (Ivy_Obj_t *)Vec_PtrEntry(p_00,local_48);
        bVar2 = _nPresent != (Ivy_Obj_t *)0x0;
      }
      if (!bVar2) goto LAB_00a383eb;
      iVar1 = Ivy_ObjIsLatch(_nPresent);
      if (iVar1 != 0) break;
      local_48 = local_48 + 1;
    }
    k = k + 1;
LAB_00a383eb:
    fVerbose = fVerbose + 1;
  } while( true );
}

Assistant:

int Ivy_CutTruthPrint( Ivy_Man_t * p, Ivy_Cut_t * pCut, unsigned uTruth )
{
    Vec_Ptr_t * vArray;
    Ivy_Obj_t * pObj, * pFanout;
    int nLatches = 0;
    int nPresent = 0;
    int i, k;
    int fVerbose = 0;

    if ( fVerbose )
        printf( "Trying cut : {" );
    for ( i = 0; i < pCut->nSize; i++ )
    {
        if ( fVerbose )
            printf( " %6d(%d)", Ivy_LeafId(pCut->pArray[i]), Ivy_LeafLat(pCut->pArray[i]) );
        nLatches += Ivy_LeafLat(pCut->pArray[i]);
    }
    if ( fVerbose )
        printf( " }   " );
    if ( fVerbose )
        printf( "Latches = %d. ", nLatches );

    // check if there are latches on the fanout edges
    vArray = Vec_PtrAlloc( 100 );
    for ( i = 0; i < pCut->nSize; i++ )
    {
        pObj = Ivy_ManObj( p, Ivy_LeafId(pCut->pArray[i]) );
        Ivy_ObjForEachFanout( p, pObj, vArray, pFanout, k )
        {
            if ( Ivy_ObjIsLatch(pFanout) )
            {
                nPresent++;
                break;
            }
        }
    }
    Vec_PtrSize( vArray );
    if ( fVerbose )
    {
        printf( "Present = %d. ", nPresent );
        if ( nLatches > nPresent )
            printf( "Clauses = %d. ", 2*(nLatches - nPresent) );
        printf( "\n" );
    }
    return ( nLatches > nPresent ) ? 2*(nLatches - nPresent) : 0;
}